

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::IO_Action_PDU::IO_Action_PDU
          (IO_Action_PDU *this,EntityIdentifier *OrigID,EntityIdentifier *RecvID,KUINT32 ReqID,
          WarfareType WT,KUINT16 SimSrc,ActionType AT,ActionPhase AP,EntityIdentifier *AtkID,
          EntityIdentifier *TgtID)

{
  KUINT16 SimSrc_local;
  WarfareType WT_local;
  KUINT32 ReqID_local;
  EntityIdentifier *RecvID_local;
  EntityIdentifier *OrigID_local;
  IO_Action_PDU *this_local;
  
  IO_Header::IO_Header(&this->super_IO_Header,OrigID);
  (this->super_IO_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IO_Action_PDU_0032d480;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_RecEntityID,RecvID);
  this->m_ui32ReqId = ReqID;
  this->m_ui16WrTyp = (KUINT16)WT;
  this->m_ui16SimSrc = SimSrc;
  this->m_ui16ActTyp = (KUINT16)AT;
  this->m_ui16ActPhs = (KUINT16)AP;
  this->m_ui32Padding = 0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_AtkEntityID,AtkID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TgtEntityID,TgtID);
  this->m_ui16Padding = 0;
  this->m_ui16NumStdVarRec = 0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::vector(&this->m_vStdVarRecs);
  (this->super_IO_Header).super_Header.super_Header6.m_ui8PDUType = 'F';
  (this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength = 0x38;
  return;
}

Assistant:

IO_Action_PDU::IO_Action_PDU( const EntityIdentifier & OrigID, const EntityIdentifier & RecvID, KUINT32 ReqID,
                              WarfareType WT, KUINT16 SimSrc, ActionType AT, ActionPhase AP,
                              const EntityIdentifier & AtkID, const EntityIdentifier & TgtID ) :
    IO_Header( OrigID ),
    m_RecEntityID( RecvID ),
    m_ui32ReqId( ReqID ),
    m_ui16WrTyp( WT ),
    m_ui16SimSrc( SimSrc ),
    m_ui16ActTyp( AT ),
    m_ui16ActPhs( AP ),
    m_ui32Padding( 0 ),
    m_AtkEntityID( AtkID ),
    m_TgtEntityID( TgtID ),
    m_ui16Padding( 0 ),
    m_ui16NumStdVarRec( 0 )
{
    m_ui8PDUType = IO_Action_PDU_Type;
    m_ui16PDULength = IO_ACTION_PDU_SIZE;
}